

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  size_type sVar10;
  exception *e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  exception *e;
  QPDFWriter w;
  undefined1 local_1d0 [8];
  QPDFObjectHandle elt;
  QPDFObjectHandle local_1b8 [2];
  QPDFObjectHandle local_198;
  allocator<char> local_181;
  string local_180 [32];
  QPDFObjectHandle local_160;
  allocator<char> local_149;
  string local_148 [32];
  reference local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  QPDFObjectHandle fileinfo;
  QPDFObjectHandle filetrailer;
  QPDF file;
  allocator<char> local_d9;
  undefined1 local_d8 [8];
  string fl_tmp;
  int local_94;
  undefined1 local_90 [4];
  int i;
  string cur_key;
  char *fl_out;
  char *fl_in;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Keys;
  bool static_id;
  char **argv_local;
  int argc_local;
  
  Keys._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc == 2) && (iVar4 = strcmp(argv[1],"--version"), iVar4 == 0)) {
    poVar5 = std::operator<<((ostream *)&std::cout,whoami);
    poVar5 = std::operator<<(poVar5," version ");
    poVar5 = std::operator<<(poVar5,version);
    std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  if ((argc == 3) && (iVar4 = strcmp(argv[1],"--dump"), iVar4 == 0)) {
    QTC::TC("examples","pdf-mod-info --dump",0);
    pdfDumpInfoDict(argv[2]);
    exit(0);
  }
  fl_out = (char *)0x0;
  cur_key.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_90);
  for (local_94 = 1; local_94 < argc; local_94 = local_94 + 1) {
    iVar4 = strcmp(argv[local_94],"--in");
    if ((iVar4 == 0) && (local_94 = local_94 + 1, local_94 < argc)) {
      fl_out = argv[local_94];
    }
    else {
      iVar4 = strcmp(argv[local_94],"--out");
      if ((iVar4 == 0) && (local_94 = local_94 + 1, local_94 < argc)) {
        cur_key.field_2._8_8_ = argv[local_94];
      }
      else {
        iVar4 = strcmp(argv[local_94],"--static-id");
        if (iVar4 == 0) {
          Keys._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
        else {
          iVar4 = strcmp(argv[local_94],"--key");
          if ((iVar4 == 0) && (local_94 = local_94 + 1, local_94 < argc)) {
            QTC::TC("examples","pdf-mod-info -key",0);
            std::__cxx11::string::operator=((string *)local_90,argv[local_94]);
            lVar6 = std::__cxx11::string::length();
            if ((lVar6 == 0) ||
               (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_90), *pcVar7 != '/')) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&fl_tmp.field_2 + 8),"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              std::__cxx11::string::operator=
                        ((string *)local_90,(string *)(fl_tmp.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(fl_tmp.field_2._M_local_buf + 8));
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(key_type *)local_90);
            std::__cxx11::string::operator=((string *)pmVar8,"");
          }
          else {
            iVar4 = strcmp(argv[local_94],"--val");
            if ((iVar4 == 0) && (local_94 = local_94 + 1, local_94 < argc)) {
              uVar9 = std::__cxx11::string::empty();
              if ((uVar9 & 1) != 0) {
                QTC::TC("examples","pdf-mod-info usage wrong val",0);
                usage();
              }
              QTC::TC("examples","pdf-mod-info -val",0);
              pcVar7 = argv[local_94];
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(key_type *)local_90);
              std::__cxx11::string::operator=((string *)pmVar8,pcVar7);
              std::__cxx11::string::clear();
            }
            else {
              QTC::TC("examples","pdf-mod-info usage junk",0);
              usage();
            }
          }
        }
      }
    }
  }
  if (fl_out == (char *)0x0) {
    QTC::TC("examples","pdf-mod-info no in file",0);
    usage();
  }
  if (cur_key.field_2._8_8_ == 0) {
    QTC::TC("examples","pdf-mod-info in-place",0);
    cur_key.field_2._8_8_ = fl_out;
  }
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50);
  if (sVar10 == 0) {
    QTC::TC("examples","pdf-mod-info no keys",0);
    usage();
  }
  uVar1 = cur_key.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,(char *)uVar1,&local_d9);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::operator+=((string *)local_d8,".tmp");
  QPDF::QPDF((QPDF *)&filetrailer.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::processFile((char *)&filetrailer.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    fl_out);
  QPDF::getTrailer();
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_50);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&it), bVar2) {
    local_128 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    bVar2 = qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)&__range1);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_148,"/Info",&local_149);
      bVar3 = QPDFObjectHandle::hasKey
                        ((string *)
                         &fileinfo.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_149);
      if ((bVar3 & 1) == 0) {
        QTC::TC("examples","pdf-mod-info file no info",0);
        QPDFObjectHandle::newDictionary();
        QPDFObjectHandle::operator=((QPDFObjectHandle *)&__range1,&local_198);
        QPDFObjectHandle::~QPDFObjectHandle(&local_198);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b8,"/Info",
                   (allocator<char> *)
                   ((long)&elt.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::replaceKey
                  ((string *)
                   &fileinfo.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_1b8
                  );
        std::__cxx11::string::~string((string *)local_1b8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&elt.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
      }
      else {
        QTC::TC("examples","pdf-mod-info has info",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_180,"/Info",&local_181);
        QPDFObjectHandle::getKey((string *)&local_160);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)&__range1,&local_160);
        QPDFObjectHandle::~QPDFObjectHandle(&local_160);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator(&local_181);
      }
    }
    bVar2 = std::operator==(&local_128->second,"");
    if (bVar2) {
      QPDFObjectHandle::removeKey((string *)&__range1);
    }
    else {
      QPDFObjectHandle::newString((string *)local_1d0);
      QPDFObjectHandle::makeDirect(SUB81(local_1d0,0));
      QPDFObjectHandle::replaceKey((string *)&__range1,(QPDFObjectHandle *)local_128);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  QPDFWriter::QPDFWriter
            ((QPDFWriter *)&e,
             (QPDF *)&filetrailer.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pcVar7)
  ;
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&e);
  QPDFWriter::setLinearization(SUB81(&e,0));
  QPDFWriter::setStaticID(SUB81(&e,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter((QPDFWriter *)&e);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &fileinfo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::~QPDF((QPDF *)&filetrailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  remove((char *)cur_key.field_2._8_8_);
  std::operator+(&local_248,"rename ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::operator+(&local_228,&local_248," ");
  uVar1 = cur_key.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,(char *)uVar1,(allocator<char> *)((long)&e_1 + 7));
  std::operator+(&local_208,&local_228,&local_268);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar4 = rename(pcVar7,(char *)cur_key.field_2._8_8_);
  QUtil::os_wrapper((string *)&local_208,iVar4);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    bool static_id = false;
    std::map<std::string, std::string> Keys;

    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (!strcmp(argv[1], "--version"))) {
        std::cout << whoami << " version " << version << std::endl;
        exit(0);
    }
    if ((argc == 3) && (!strcmp(argv[1], "--dump"))) {
        QTC::TC("examples", "pdf-mod-info --dump");
        pdfDumpInfoDict(argv[2]);
        exit(0);
    }

    char* fl_in = nullptr;
    char* fl_out = nullptr;
    std::string cur_key;

    for (int i = 1; i < argc; ++i) {
        if ((!strcmp(argv[i], "--in")) && (++i < argc)) {
            fl_in = argv[i];
        } else if ((!strcmp(argv[i], "--out")) && (++i < argc)) {
            fl_out = argv[i];
        } else if (!strcmp(argv[i], "--static-id")) // don't document
        {
            static_id = true; // this should be used in test suites only
        } else if ((!strcmp(argv[i], "--key")) && (++i < argc)) {
            QTC::TC("examples", "pdf-mod-info -key");
            cur_key = argv[i];
            if (!((cur_key.length() > 0) && (cur_key.at(0) == '/'))) {
                cur_key = "/" + cur_key;
            }
            Keys[cur_key] = "";
        } else if ((!strcmp(argv[i], "--val")) && (++i < argc)) {
            if (cur_key.empty()) {
                QTC::TC("examples", "pdf-mod-info usage wrong val");
                usage();
            }
            QTC::TC("examples", "pdf-mod-info -val");
            Keys[cur_key] = argv[i];
            cur_key.clear();
        } else {
            QTC::TC("examples", "pdf-mod-info usage junk");
            usage();
        }
    }
    if (!fl_in) {
        QTC::TC("examples", "pdf-mod-info no in file");
        usage();
    }
    if (!fl_out) {
        QTC::TC("examples", "pdf-mod-info in-place");
        fl_out = fl_in;
    }
    if (Keys.size() == 0) {
        QTC::TC("examples", "pdf-mod-info no keys");
        usage();
    }

    std::string fl_tmp = fl_out;
    fl_tmp += ".tmp";

    try {
        QPDF file;
        file.processFile(fl_in);

        QPDFObjectHandle filetrailer = file.getTrailer();
        QPDFObjectHandle fileinfo;

        for (auto const& it: Keys) {
            if (!fileinfo) {
                if (filetrailer.hasKey("/Info")) {
                    QTC::TC("examples", "pdf-mod-info has info");
                    fileinfo = filetrailer.getKey("/Info");
                } else {
                    QTC::TC("examples", "pdf-mod-info file no info");
                    fileinfo = QPDFObjectHandle::newDictionary();
                    filetrailer.replaceKey("/Info", fileinfo);
                }
            }
            if (it.second == "") {
                fileinfo.removeKey(it.first);
            } else {
                QPDFObjectHandle elt = fileinfo.newString(it.second);
                elt.makeDirect();
                fileinfo.replaceKey(it.first, elt);
            }
        }
        QPDFWriter w(file, fl_tmp.c_str());
        w.setStreamDataMode(qpdf_s_preserve);
        w.setLinearization(true);
        w.setStaticID(static_id); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    try {
        (void)remove(fl_out);
        QUtil::os_wrapper(
            "rename " + fl_tmp + " " + std::string(fl_out), rename(fl_tmp.c_str(), fl_out));
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}